

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void mov_DdRd(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UIntPtr UVar3;
  ulong uVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  uint uVar12;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mov",4);
    (pMyDisasm->Reserved_).OperandSize =
         (uint)((pMyDisasm->Reserved_).Architecture == 0x40) * 0x20 + 0x20;
    UVar3 = (pMyDisasm->Reserved_).EIP_;
    uVar4 = (pMyDisasm->Reserved_).EndOfBlock;
    if (uVar4 < UVar3 + 2 && uVar4 != 0) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
    else {
      uVar12 = *(byte *)(UVar3 + 1) & 7;
      (pMyDisasm->Reserved_).RM_ = uVar12;
      (*ModRM_3[uVar12])(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 0x80;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x43].SF_;
      UVar6 = EFLAGS_TABLE[0x43].ZF_;
      UVar7 = EFLAGS_TABLE[0x43].AF_;
      UVar8 = EFLAGS_TABLE[0x43].PF_;
      UVar9 = EFLAGS_TABLE[0x43].CF_;
      UVar10 = EFLAGS_TABLE[0x43].TF_;
      UVar11 = EFLAGS_TABLE[0x43].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x43].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      UVar5 = EFLAGS_TABLE[0x43].NT_;
      UVar6 = EFLAGS_TABLE[0x43].RF_;
      UVar7 = EFLAGS_TABLE[0x43].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x43].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar5;
      (pMyDisasm->Instruction).Flags.RF_ = UVar6;
      (pMyDisasm->Instruction).Flags.alignment = UVar7;
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ mov_DdRd(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
  #endif
  GV.OperandSize = (GV.Architecture == 64) ? 64 : 32;
  if (!Security(2, pMyDisasm)) return;
  GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
  ModRM_3[GV.RM_](&pMyDisasm->Operand2, pMyDisasm);
  GV.Register_ = DR_REG;
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

  FillFlags(pMyDisasm,67);
  GV.EIP_ += 2;
}